

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_state.cc
# Opt level: O0

bool __thiscall hwtest::pgraph::BetaRegister::scan_test(BetaRegister *this,int cnum,mt19937 *rnd)

{
  uint uVar1;
  result_type rVar2;
  uint local_34;
  uint32_t real;
  uint32_t exp;
  uint32_t orig;
  int i;
  mt19937 *rnd_local;
  int cnum_local;
  BetaRegister *this_local;
  
  exp = 0;
  while( true ) {
    if (999 < (int)exp) {
      return false;
    }
    rVar2 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(rnd);
    (*(this->super_SimpleMmioRegister).super_MmioRegister.super_Register._vptr_Register[7])
              (this,(ulong)(uint)cnum,rVar2 & 0xffffffff);
    local_34 = (uint)rVar2 & 0x7f800000;
    if ((rVar2 & 0x80000000) != 0) {
      local_34 = 0;
    }
    uVar1 = (*(this->super_SimpleMmioRegister).super_MmioRegister.super_Register._vptr_Register[6])
                      (this,(ulong)(uint)cnum);
    if (uVar1 != local_34) break;
    exp = exp + 1;
  }
  printf("BETA scan mismatch: orig %08x expected %08x real %08x\n",rVar2 & 0xffffffff,
         (ulong)local_34,(ulong)uVar1);
  return true;
}

Assistant:

bool scan_test(int cnum, std::mt19937 &rnd) override {
		for (int i = 0; i < 1000; i++) {
			uint32_t orig = rnd();
			write(cnum, orig);
			uint32_t exp = orig & 0x7f800000;
			if (orig & 0x80000000)
				exp = 0;
			uint32_t real = read(cnum);
			if (real != exp) {
				printf("BETA scan mismatch: orig %08x expected %08x real %08x\n", orig, exp, real);
				return true;
			}
		}
		return false;
	}